

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O3

void testMinMaxEigenValueImp<double>(void)

{
  Matrix44<double> local_98;
  
  local_98.x[0][0] = 1.0;
  local_98.x[0][1] = 0.0;
  local_98.x[0][2] = 0.0;
  local_98.x[0][3] = 0.0;
  local_98.x[1][0] = 1e-10;
  local_98.x[1][1] = 0.0;
  local_98.x[1][2] = 0.0;
  local_98.x[1][3] = 0.0;
  local_98.x[2][0] = 10000000000.0;
  testMinMaxEigenValue<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&local_98);
  local_98.x[0][0] = 0.25058694044821;
  local_98.x[0][1] = 0.49427229444416;
  local_98.x[0][2] = 0.81415724537748;
  local_98.x[0][3] = 0.49427229444416;
  local_98.x[1][0] = 0.80192384710853;
  local_98.x[1][1] = -0.6167494822491;
  local_98.x[1][2] = 0.81415724537748;
  local_98.x[1][3] = -0.6167494822491;
  local_98.x[2][0] = -1.28486154645285;
  testMinMaxEigenValue<Imath_3_2::Matrix33<double>>((Matrix33<double> *)&local_98);
  local_98.x[0][0] = 1.0;
  local_98.x[0][1] = 0.0;
  local_98.x[0][2] = 0.0;
  local_98.x[0][3] = 0.0;
  local_98.x[1][0] = 0.0;
  local_98.x[1][1] = 1e-20;
  local_98.x[1][2] = 0.0;
  local_98.x[1][3] = 0.0;
  local_98.x[2][0] = 0.0;
  local_98.x[2][1] = 0.0;
  local_98.x[2][2] = 0.0;
  local_98.x[2][3] = 0.0;
  local_98.x[3][0] = 0.0;
  local_98.x[3][1] = 0.0;
  local_98.x[3][2] = 0.0;
  local_98.x[3][3] = 1e+20;
  testMinMaxEigenValue<Imath_3_2::Matrix44<double>>(&local_98);
  local_98.x[0][0] = 4.05747631538951;
  local_98.x[0][1] = 0.163581230756;
  local_98.x[0][2] = 0.11541756047409;
  local_98.x[0][3] = -1.6536922346527;
  local_98.x[1][0] = 0.163581230756;
  local_98.x[1][1] = 0.5762982939078;
  local_98.x[1][2] = 3.88542912704029;
  local_98.x[1][3] = 0.92016316185369;
  local_98.x[2][0] = 0.11541756047409;
  local_98.x[2][1] = 3.88542912704029;
  local_98.x[2][2] = 0.65367032943707;
  local_98.x[2][3] = -0.2197110327041;
  local_98.x[3][0] = -1.6536922346527;
  local_98.x[3][1] = 0.92016316185369;
  local_98.x[3][2] = -0.2197110327041;
  local_98.x[3][3] = -0.28108876552761;
  testMinMaxEigenValue<Imath_3_2::Matrix44<double>>(&local_98);
  return;
}

Assistant:

void
testMinMaxEigenValueImp ()
{
    testMinMaxEigenValue (Matrix33<T> (A33_7));
    testMinMaxEigenValue (Matrix33<T> (A33_8));

    testMinMaxEigenValue (Matrix44<T> (A44_7));
    testMinMaxEigenValue (Matrix44<T> (A44_8));
}